

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::receive(WebSocketImpl *this,size_t maxSize)

{
  PromiseArena *pPVar1;
  undefined8 *puVar2;
  undefined8 node;
  OwnPromiseNode OVar3;
  Context *pCVar4;
  byte bVar5;
  Array<unsigned_char> *__begin4;
  ulong uVar6;
  void *pvVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  long lVar9;
  byte bVar10;
  char *pcVar11;
  WebSocketImpl *in_RDX;
  ulong __n;
  Array<unsigned_char> *fragment_1;
  WebSocketImpl *pWVar12;
  undefined8 *puVar13;
  size_t sVar14;
  uint16_t code;
  byte *__dest;
  unsigned_long *in_R9;
  WebSocketImpl *elementCount;
  byte *__src;
  StringPtr reason;
  StringPtr reason_00;
  StringPtr reason_01;
  Array<unsigned_char> message;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17),_unsigned_long>
  promise;
  Vector<kj::Array<unsigned_char>_> *__range4;
  size_t payloadLen;
  anon_class_96_10_18673444_for_func handleMessage;
  byte local_24d;
  undefined1 local_24c;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_248;
  WebSocketImpl *pWStack_240;
  undefined8 *local_238;
  undefined1 local_228 [16];
  OwnPromiseNode local_218;
  size_t local_210;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_208;
  anon_class_16_2_99444263_for_func local_200;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_1f0;
  WebSocketImpl *local_1e8;
  WebSocketImpl *local_1e0;
  ArrayBuilder<kj::Array<unsigned_char>_> *local_1d8;
  WebSocketImpl *local_1d0;
  Exception local_1c8;
  
  if (*(char *)(maxSize + 0x178) == '\x01') {
    Exception::Exception(&local_1c8,(Exception *)(maxSize + 0x180));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)this,&local_1c8);
    Exception::~Exception(&local_1c8);
    return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
           (PromiseNode *)this;
  }
  __src = *(byte **)(maxSize + 0x398);
  __n = *(ulong *)(maxSize + 0x3a0);
  uVar6 = 2;
  if (1 < __n) {
    lVar9 = (ulong)(__src[1] >> 7) * 4;
    uVar6 = lVar9 + 2;
    bVar10 = __src[1] & 0x7f;
    if (bVar10 == 0x7e) {
      uVar6 = lVar9 + 4;
    }
    else if (bVar10 == 0x7f) {
      uVar6 = uVar6 | 8;
    }
  }
  if (__n < uVar6) {
    __dest = *(byte **)(maxSize + 0x380);
    local_200.remaining = (size_t)in_RDX;
    if (__src != __dest) {
      if (__n == 0) {
        __n = 0;
      }
      else {
        memmove(__dest,__src,__n);
        __dest = *(byte **)(maxSize + 0x380);
        __n = *(ulong *)(maxSize + 0x3a0);
      }
      *(byte **)(maxSize + 0x398) = __dest;
      *(ulong *)(maxSize + 0x3a0) = __n;
      __src = __dest;
    }
    (**(code **)(**(long **)(maxSize + 0x18) + 8))
              (&local_218,*(long **)(maxSize + 0x18),__src + __n,1,
               __dest + (*(long *)(maxSize + 0x388) - (long)(__src + __n)));
    OVar3.ptr = local_218.ptr;
    pPVar1 = ((local_218.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_218.ptr - (long)pPVar1) < 0x30) {
      pvVar7 = operator_new(0x400);
      aVar8.value = (long)pvVar7 + 0x3d0;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)aVar8,&local_218,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2708:17)>
                 ::anon_class_16_2_007aca32_for_func::operator());
      *(undefined ***)((long)pvVar7 + 0x3d0) = &PTR_destroy_0061a1c0;
      *(size_t *)((long)pvVar7 + 0x3f0) = maxSize;
      *(size_t *)((long)pvVar7 + 0x3f8) = local_200.remaining;
      *(void **)((long)pvVar7 + 0x3d8) = pvVar7;
    }
    else {
      ((local_218.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      aVar8.value = (unsigned_long)(local_218.ptr + -3);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)aVar8,&local_218,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2708:17)>
                 ::anon_class_16_2_007aca32_for_func::operator());
      OVar3.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0061a1c0;
      OVar3.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)maxSize;
      OVar3.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_200.remaining;
      OVar3.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
    }
    local_1c8.ownFile.content.ptr =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_1c8.ownFile.content.size_ = (size_t)&DAT_0048a1d0;
    local_1c8.ownFile.content.disposer = (ArrayDisposer *)&DAT_4c0000058b;
    local_248 = aVar8;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this,(OwnPromiseNode *)&local_248,(SourceLocation *)&local_1c8);
    aVar8 = local_248;
    if ((TransformPromiseNodeBase *)local_248.value != (TransformPromiseNodeBase *)0x0) {
      local_248.value = 0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar8);
    }
    OVar3.ptr = local_218.ptr;
    if (&(local_218.ptr)->super_PromiseArenaMember == (PromiseArenaMember *)0x0) {
      return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
             (PromiseNode *)this;
    }
    local_218.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
           (PromiseNode *)this;
  }
  code = (uint16_t)maxSize;
  if ((*__src & 0x30) == 0) {
    *(byte **)(maxSize + 0x398) = __src + uVar6;
    *(ulong *)(maxSize + 0x3a0) = __n - uVar6;
    pWVar12 = (WebSocketImpl *)(ulong)(__src[1] & 0x7f);
    if (pWVar12 == (WebSocketImpl *)0x7e) {
      pWVar12 = (WebSocketImpl *)
                (ulong)(ushort)(*(ushort *)(__src + 2) << 8 | *(ushort *)(__src + 2) >> 8);
    }
    else if ((__src[1] & 0x7f) == 0x7f) {
      uVar6 = *(ulong *)(__src + 2);
      pWVar12 = (WebSocketImpl *)
                (uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                 (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                 (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38);
    }
    local_1d0 = pWVar12;
    if (in_RDX < pWVar12) {
      str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
                (&local_1c8.ownFile,(kj *)"Message is too large: ",(char (*) [23])&local_1d0,
                 (unsigned_long *)" > ",(char (*) [4])&local_200.remaining,in_R9);
      pcVar11 = local_1c8.ownFile.content.ptr;
      if (local_1c8.ownFile.content.size_ == 0) {
        pcVar11 = "";
      }
      reason_00.content.size_ = (size_t)pcVar11;
      reason_00.content.ptr = (char *)0x3f1;
      sendCloseDueToError((WebSocketImpl *)&local_248,code,reason_00);
      Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
      attach<kj::String>((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                          *)this,(String *)&local_248);
      aVar8 = local_248;
      if ((PromiseArenaMember *)local_248.value != (PromiseArenaMember *)0x0) {
        local_248.value = 0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar8);
      }
      sVar14 = local_1c8.ownFile.content.size_;
      pcVar11 = local_1c8.ownFile.content.ptr;
      if (local_1c8.ownFile.content.ptr == (char *)0x0) {
        return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
               (PromiseNode *)this;
      }
      local_1c8.ownFile.content.ptr = (char *)0x0;
      local_1c8.ownFile.content.size_ = 0;
      (**(local_1c8.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.ownFile.content.disposer,pcVar11,1,sVar14,sVar14,0);
      return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
             (PromiseNode *)this;
    }
    bVar10 = *__src;
    bVar5 = bVar10 & 0xf;
    local_228._8_8_ = this;
    if (bVar5 == 0) {
      if (*(long *)(maxSize + 0x368) == *(long *)(maxSize + 0x360)) {
        pcVar11 = "Unexpected continuation frame";
        goto LAB_0039cf60;
      }
      local_24d = *(byte *)(maxSize + 0x358);
      if ((char)bVar10 < '\0') goto LAB_0039d365;
LAB_0039d2d8:
      local_238 = (undefined8 *)0x0;
      pWStack_240 = (WebSocketImpl *)0x0;
      local_248.value = 0;
      aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              kj::_::HeapArrayDisposer::allocateImpl
                        (1,(size_t)pWVar12,(size_t)pWVar12,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
      local_1c8.ownFile.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_238 = &kj::_::HeapArrayDisposer::instance;
      local_1c8.ownFile.content.ptr = (char *)0x0;
      local_1c8.ownFile.content.size_ = 0;
      local_248 = aVar8;
      pWStack_240 = pWVar12;
      Array<unsigned_char>::~Array((Array<unsigned_char> *)&local_1c8);
      if (*(long *)(maxSize + 0x368) == *(long *)(maxSize + 0x360)) {
        *(uint *)(maxSize + 0x358) = (uint)local_24d;
        *(byte *)(maxSize + 0x35c) = *__src >> 6 & 1;
      }
      local_1c8.type._0_1_ = FAILED;
      local_24c = 0;
      in_RDX = this;
      local_1c8.remoteTrace.content.ptr = (char *)pWVar12;
      local_1c8.context.ptr.ptr = (Context *)aVar8;
    }
    else {
      local_24d = bVar5;
      if (bVar5 < 8) {
        if (*(long *)(maxSize + 0x368) != *(long *)(maxSize + 0x360)) {
          pcVar11 = "Missing continuation frame";
          goto LAB_0039cf60;
        }
        if (-1 < (char)bVar10) goto LAB_0039d2d8;
      }
      else {
        local_248.value = 0;
        pWStack_240 = (WebSocketImpl *)0x0;
        local_238 = (undefined8 *)0x0;
        if (-1 < (char)bVar10) {
          reason_01.content.size_ = (size_t)"Received fragmented control frame";
          reason_01.content.ptr = (char *)0x3ea;
          sendCloseDueToError(this,code,reason_01);
          return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
                 (PromiseNode *)this;
        }
      }
LAB_0039d365:
      local_238 = (undefined8 *)0x0;
      pWStack_240 = (WebSocketImpl *)0x0;
      local_248.value = 0;
      local_24c = 1;
      uVar6 = 4;
      if (((bVar10 & 0x40) == 0) && (*(char *)(maxSize + 0x35c) == '\0')) {
        uVar6 = (ulong)(local_24d == 1);
        local_24c = 0;
      }
      local_1c8.remoteTrace.content.ptr =
           (char *)((long)&(pWVar12->super_WebSocket)._vptr_WebSocket + uVar6);
      if (bVar5 < 8) {
        lVar9 = *(long *)(maxSize + 0x360);
        if (*(long *)(maxSize + 0x368) != lVar9) {
          local_1d8 = (ArrayBuilder<kj::Array<unsigned_char>_> *)(maxSize + 0x360);
          aVar8.value = 0;
          do {
            aVar8.value = aVar8.value + *(long *)(lVar9 + 8);
            lVar9 = lVar9 + 0x18;
          } while (lVar9 != *(long *)(maxSize + 0x368));
          elementCount = (WebSocketImpl *)
                         ((long)&(((WebSocketImpl *)local_1c8.remoteTrace.content.ptr)->
                                 super_WebSocket)._vptr_WebSocket + aVar8.value);
          local_248 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                      kj::_::HeapArrayDisposer::allocateImpl
                                (1,(size_t)elementCount,(size_t)elementCount,
                                 (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
          local_1c8.ownFile.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          local_238 = &kj::_::HeapArrayDisposer::instance;
          local_1c8.ownFile.content.ptr = (char *)0x0;
          local_1c8.ownFile.content.size_ = 0;
          pWStack_240 = elementCount;
          local_208 = local_248;
          local_1f0.value = aVar8.value;
          local_1e8 = elementCount;
          local_1e0 = pWVar12;
          Array<unsigned_char>::~Array((Array<unsigned_char> *)&local_1c8);
          puVar2 = *(undefined8 **)(maxSize + 0x368);
          lVar9 = 0;
          for (puVar13 = *(undefined8 **)(maxSize + 0x360); puVar13 != puVar2; puVar13 = puVar13 + 3
              ) {
            memcpy((void *)(local_208.value + lVar9),(void *)*puVar13,puVar13[1]);
            lVar9 = lVar9 + puVar13[1];
          }
          in_RDX = (WebSocketImpl *)
                   ((long)&(in_RDX->super_WebSocket)._vptr_WebSocket + local_1f0.value);
          ArrayBuilder<kj::Array<unsigned_char>_>::clear(local_1d8);
          aVar8.value = local_208.value + lVar9;
          *(undefined4 *)(maxSize + 0x358) = 0;
          *(undefined1 *)(maxSize + 0x35c) = 0;
          local_1c8.type._0_1_ = OVERLOADED;
          pWVar12 = local_1e0;
          local_1c8.remoteTrace.content.ptr = (char *)local_1e8;
          local_1c8.context.ptr.ptr = (Context *)local_208;
          goto LAB_0039d4fb;
        }
      }
      aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              kj::_::HeapArrayDisposer::allocateImpl
                        (1,(size_t)local_1c8.remoteTrace.content.ptr,
                         (size_t)local_1c8.remoteTrace.content.ptr,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
      local_1c8.ownFile.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_238 = &kj::_::HeapArrayDisposer::instance;
      local_1c8.ownFile.content.ptr = (char *)0x0;
      local_1c8.ownFile.content.size_ = 0;
      local_248 = aVar8;
      pWStack_240 = (WebSocketImpl *)local_1c8.remoteTrace.content.ptr;
      Array<unsigned_char>::~Array((Array<unsigned_char> *)&local_1c8);
      local_1c8.type._0_1_ = OVERLOADED;
      local_1c8.context.ptr.ptr = (Context *)aVar8;
    }
LAB_0039d4fb:
    local_1c8.line = 0;
    if ((char)__src[1] < '\0') {
      bVar10 = __src[1] & 0x7f;
      lVar9 = 10;
      if (bVar10 != 0x7f) {
        lVar9 = (ulong)(bVar10 == 0x7e) * 2 + 2;
      }
      local_1c8.line = *(int *)(__src + lVar9);
    }
    local_1c8.ownFile.content.size_ = CONCAT71(local_1c8.ownFile.content.size_._1_7_,local_24d);
    if ((undefined1)local_1c8.type != FAILED) {
      local_1c8.description.content.disposer = (ArrayDisposer *)in_RDX;
    }
    local_1c8.context.ptr.disposer._0_1_ = local_24c;
    local_1c8.remoteTrace.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
    local_248.value = 0;
    pWStack_240 = (WebSocketImpl *)0x0;
    local_1c8.ownFile.content.ptr = (char *)maxSize;
    local_1c8.ownFile.content.disposer = (ArrayDisposer *)aVar8;
    local_1c8.file = (char *)pWVar12;
    local_1c8.description.content.size_._0_1_ = (undefined1)local_1c8.type;
    if (*(WebSocketImpl **)(maxSize + 0x3a0) < pWVar12) {
      memcpy((void *)aVar8,*(void **)(maxSize + 0x398),(size_t)*(WebSocketImpl **)(maxSize + 0x3a0))
      ;
      sVar14 = (long)pWVar12 - *(long *)(maxSize + 0x3a0);
      (**(code **)(**(long **)(maxSize + 0x18) + 8))
                (&local_200,*(long **)(maxSize + 0x18),aVar8.value + *(long *)(maxSize + 0x3a0),
                 sVar14,sVar14);
      this = (WebSocketImpl *)local_228._8_8_;
      local_218.ptr = (PromiseNode *)maxSize;
      local_210 = sVar14;
      Promise<unsigned_long>::
      then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_>
                ((Promise<unsigned_long> *)local_228,&local_200);
      pWVar12 = local_200.this;
      if (local_200.this != (WebSocketImpl *)0x0) {
        local_200.this = (WebSocketImpl *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pWVar12);
      }
      *(undefined8 *)(maxSize + 0x398) = 0;
      *(undefined8 *)(maxSize + 0x3a0) = 0;
      Promise<void>::
      then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_>
                ((Promise<void> *)this,(anon_class_96_10_18673444_for_func *)local_228);
      node = local_228._0_8_;
      if ((PromiseArenaMember *)local_228._0_8_ != (PromiseArenaMember *)0x0) {
        local_228._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
    }
    else {
      memcpy((void *)aVar8,*(void **)(maxSize + 0x398),(size_t)pWVar12);
      this = (WebSocketImpl *)local_228._8_8_;
      *(long *)(maxSize + 0x398) =
           (long)&(pWVar12->super_WebSocket)._vptr_WebSocket + *(long *)(maxSize + 0x398);
      *(long *)(maxSize + 0x3a0) = *(long *)(maxSize + 0x3a0) - (long)pWVar12;
      kj::_::
      SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2811:9)>
      ::anon_class_96_10_18673444_for_func::operator()
                ((anon_class_96_10_18673444_for_func *)local_228._8_8_);
    }
    pcVar11 = local_1c8.remoteTrace.content.ptr;
    pCVar4 = local_1c8.context.ptr.ptr;
    if (local_1c8.context.ptr.ptr != (Context *)0x0) {
      local_1c8.context.ptr.ptr = (Context *)0x0;
      local_1c8.remoteTrace.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_1c8.remoteTrace.content.size_)
                (local_1c8.remoteTrace.content.size_,pCVar4,1,pcVar11,pcVar11,0);
    }
    pWVar12 = pWStack_240;
    aVar8 = local_248;
    if (local_248.value != 0) {
      local_248.value = 0;
      pWStack_240 = (WebSocketImpl *)0x0;
      (**(code **)*local_238)(local_238,aVar8.value,1,pWVar12,pWVar12,0);
    }
  }
  else {
    pcVar11 = "Received frame had RSV bits 2 or 3 set";
LAB_0039cf60:
    reason.content.size_ = (size_t)pcVar11;
    reason.content.ptr = (char *)0x3ea;
    sendCloseDueToError(this,code,reason);
  }
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         (PromiseNode *)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
    KJ_IF_SOME(ex, receiveException) {
      return kj::cp(ex);
    }

    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.first(recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this,maxSize](size_t actual) -> kj::Promise<Message> {
        receivedBytes += actual;
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.first(recvData.size() + actual);
        return receive(maxSize);
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());
    if (recvHeader.hasRsv2or3()) {
      return sendCloseDueToError(1002, "Received frame had RSV bits 2 or 3 set");
    }

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();
    if (payloadLen > maxSize) {
      auto description = kj::str("Message is too large: ", payloadLen, " > ", maxSize);
      return sendCloseDueToError(1009, description.asPtr()).attach(kj::mv(description));
    }

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      if (fragments.empty()) {
        return sendCloseDueToError(1002, "Unexpected continuation frame");
      }

      opcode = fragmentOpcode;
    } else if (isData) {
      if (!fragments.empty()) {
        return sendCloseDueToError(1002, "Missing continuation frame");
      }
    }

    bool isFin = recvHeader.isFin();
    bool isCompressed = false;

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    kj::Maybe<size_t> originalMaxSize; // maxSize from first `receive()` call
    if (isFin) {
      size_t amountToAllocate;
      if (recvHeader.isCompressed() || fragmentCompressed) {
        // Add 4 since we append 0x00 0x00 0xFF 0xFF to the tail of the payload.
        // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
        amountToAllocate = payloadLen + 4;
        isCompressed = true;
      } else {
        // Add space for NUL terminator when allocating text message.
        amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);
      }

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);
        originalMaxSize = offset + maxSize; // gives us back the original maximum message size.

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
        fragmentCompressed = false;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        originalMaxSize = maxSize; // gives us back the original maximum message size.
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      if (!isData) {
        return sendCloseDueToError(1002, "Received fragmented control frame");
      }

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
        fragmentCompressed = recvHeader.isCompressed();
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage =
        [this,opcode,payloadTarget,payloadLen,mask,isFin,maxSize,originalMaxSize,
         isCompressed,message=kj::mv(message)]() mutable
        -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        auto newMax = maxSize - message.size();
        fragments.add(kj::mv(message));
        return receive(newMax);
      }

      // Provide a reasonable error if a compressed frame is received without compression enabled.
      if (isCompressed && compressionConfig == kj::none) {
        return sendCloseDueToError(
            1002,
            "Received a WebSocket frame whose compression bit was set, but the compression "
            "extension was not negotiated for this connection.");
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            bool addNullTerminator = true;
            // We want to add the null terminator when receiving a TEXT message.
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize,
                addNullTerminator);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(kj::String(decompressed.releaseAsChars()));
              }
            }
          }
#endif // KJ_HAS_ZLIB
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(decompressed.releaseAsBytes());
              }
            }
          }
#endif // KJ_HAS_ZLIB
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive(maxSize);
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive(maxSize);
        default:
          {
            auto description = kj::str("Unknown opcode ", opcode);
            return sendCloseDueToError(1002, description.asPtr()).attach(kj::mv(description));
          }
      }
    };

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([this, remaining](size_t amount) {
        receivedBytes += amount;
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }